

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__out_gif_code(stbi__gif *g,stbi__uint16 code)

{
  stbi__uint16 code_00;
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  int iVar4;
  ulong uVar5;
  undefined6 in_register_00000032;
  long lVar6;
  
  uVar5 = CONCAT62(in_register_00000032,code) & 0xffffffff;
  code_00 = g->codes[uVar5].prefix;
  if (-1 < (short)code_00) {
    stbi__out_gif_code(g,code_00);
  }
  if (g->cur_y < g->max_y) {
    psVar2 = g->color_table;
    uVar5 = (ulong)g->codes[uVar5].suffix;
    if ((char)psVar2[uVar5 * 4 + 3] < '\0') {
      psVar3 = g->out;
      lVar6 = (long)g->cur_x + (long)g->cur_y;
      psVar3[lVar6] = psVar2[uVar5 * 4 + 2];
      psVar3[lVar6 + 1] = psVar2[uVar5 * 4 + 1];
      psVar3[lVar6 + 2] = psVar2[uVar5 * 4];
      psVar3[lVar6 + 3] = psVar2[uVar5 * 4 + 3];
    }
    iVar4 = g->cur_x + 4;
    g->cur_x = iVar4;
    if (g->max_x <= iVar4) {
      g->cur_x = g->start_x;
      iVar4 = g->cur_y + g->step;
      g->cur_y = iVar4;
      while ((g->max_y <= iVar4 && (iVar1 = g->parse, 0 < iVar1))) {
        iVar4 = g->line_size << ((byte)iVar1 & 0x1f);
        g->step = iVar4;
        iVar4 = (iVar4 >> 1) + g->start_y;
        g->cur_y = iVar4;
        g->parse = iVar1 + -1;
      }
    }
  }
  return;
}

Assistant:

static void stbi__out_gif_code(stbi__gif *g, stbi__uint16 code)
{
   stbi_uc *p, *c;

   // recurse to decode the prefixes, since the linked-list is backwards,
   // and working backwards through an interleaved image would be nasty
   if (g->codes[code].prefix >= 0)
      stbi__out_gif_code(g, g->codes[code].prefix);

   if (g->cur_y >= g->max_y) return;

   p = &g->out[g->cur_x + g->cur_y];
   c = &g->color_table[g->codes[code].suffix * 4];

   if (c[3] >= 128) {
      p[0] = c[2];
      p[1] = c[1];
      p[2] = c[0];
      p[3] = c[3];
   }
   g->cur_x += 4;

   if (g->cur_x >= g->max_x) {
      g->cur_x = g->start_x;
      g->cur_y += g->step;

      while (g->cur_y >= g->max_y && g->parse > 0) {
         g->step = (1 << g->parse) * g->line_size;
         g->cur_y = g->start_y + (g->step >> 1);
         --g->parse;
      }
   }
}